

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O0

int Abc_NtkTestScorrWriteEquivGia(Tst_Dat_t *pData)

{
  Abc_Ntk_t *pNetlist_00;
  Vec_Int_t *vId2Name_00;
  Gia_Man_t *p;
  int iVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  Gia_Obj_t *pObj_00;
  bool bVar4;
  uint local_50;
  int local_4c;
  int Counter;
  int i;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  FILE *pFile;
  char *pFileNameOut;
  Gia_Man_t *pGia;
  Vec_Int_t *vId2Name;
  Abc_Ntk_t *pNetlist;
  Tst_Dat_t *pData_local;
  
  pNetlist_00 = pData->pNetlist;
  vId2Name_00 = pData->vId2Name;
  p = pData->pGia;
  pFile = (FILE *)pData->pFileNameOut;
  local_50 = 0;
  if (pData->fDumpBmc != 0) {
    pData->fDumpBmc = 0;
    pFile = (FILE *)Abc_NtkBmcFileName((char *)pFile);
  }
  __stream = fopen((char *)pFile,"wb");
  Gia_ManSetPhase(p);
  local_4c = 0;
  do {
    bVar4 = false;
    if (local_4c < p->nObjs) {
      pRepr = Gia_ManObj(p,local_4c);
      bVar4 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) {
      fclose(__stream);
      printf("%d pairs of sequentially equivalent nodes are written into file \"%s\".\n",
             (ulong)local_50,pFile);
      return local_50;
    }
    iVar1 = Gia_ObjHasRepr(p,local_4c);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjRepr(p,local_4c);
      pObj_00 = Gia_ManObj(p,iVar1);
      if (pData->fFlopOnly == 0) {
        if (((pData->fFfNdOnly != 0) && (iVar1 = Gia_ObjIsRo(p,pRepr), iVar1 == 0)) &&
           (iVar1 = Gia_ObjIsRo(p,pObj_00), iVar1 == 0)) {
          iVar1 = Gia_ObjIsConst0(pObj_00);
joined_r0x00311528:
          if (iVar1 == 0) goto LAB_00311613;
        }
      }
      else {
        iVar1 = Gia_ObjIsRo(p,pRepr);
        if (iVar1 == 0) goto LAB_00311613;
        iVar1 = Gia_ObjIsRo(p,pObj_00);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsConst0(pObj_00);
          goto joined_r0x00311528;
        }
      }
      iVar1 = Gia_ObjRepr(p,local_4c);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjPhase(pRepr);
        iVar1 = Abc_NtkTestScorrWriteEquivConst
                          (pNetlist_00,vId2Name_00,local_4c,(FILE *)__stream,iVar1);
      }
      else {
        iVar1 = Gia_ObjRepr(p,local_4c);
        uVar2 = Gia_ObjPhase(pObj_00);
        uVar3 = Gia_ObjPhase(pRepr);
        iVar1 = Abc_NtkTestScorrWriteEquivPair
                          (pNetlist_00,vId2Name_00,iVar1,local_4c,(FILE *)__stream,uVar2 ^ uVar3);
      }
      local_50 = iVar1 + local_50;
    }
LAB_00311613:
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

int Abc_NtkTestScorrWriteEquivGia( Tst_Dat_t * pData )
{
    Abc_Ntk_t * pNetlist = pData->pNetlist;
    Vec_Int_t * vId2Name = pData->vId2Name;
    Gia_Man_t * pGia     = pData->pGia;
    char * pFileNameOut  = pData->pFileNameOut;
    FILE * pFile;
    Gia_Obj_t * pObj, * pRepr;
    int i, Counter = 0;
    if ( pData->fDumpBmc )
    {
        pData->fDumpBmc = 0;
        pFileNameOut = Abc_NtkBmcFileName( pFileNameOut );
    }
    pFile = fopen( pFileNameOut, "wb" );
    Gia_ManSetPhase( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !Gia_ObjHasRepr(pGia, i) )
            continue;
        pRepr = Gia_ManObj( pGia,Gia_ObjRepr(pGia, i) );
        if ( pData->fFlopOnly )
        {
            if ( !Gia_ObjIsRo(pGia, pObj) || !(Gia_ObjIsRo(pGia, pRepr)||Gia_ObjIsConst0(pRepr)) )
                continue;
        }
        else if ( pData->fFfNdOnly )
        {
            if ( !Gia_ObjIsRo(pGia, pObj) && !(Gia_ObjIsRo(pGia, pRepr)||Gia_ObjIsConst0(pRepr)) )
                continue;
        }
        if ( Gia_ObjRepr(pGia, i) == 0 )
            Counter += Abc_NtkTestScorrWriteEquivConst( pNetlist, vId2Name, i, pFile, Gia_ObjPhase(pObj) );
        else
            Counter += Abc_NtkTestScorrWriteEquivPair( pNetlist, vId2Name, Gia_ObjRepr(pGia, i), i, pFile, 
                Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
    }
    fclose( pFile );
    printf( "%d pairs of sequentially equivalent nodes are written into file \"%s\".\n", Counter, pFileNameOut );
    return Counter;
}